

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_is_valid_ecode(int ecode)

{
  undefined4 local_c;
  int ecode_local;
  
  if (((ecode < 0) || (0x28 < ecode)) || ((ecode & 1U) != 0)) {
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int nifti_is_valid_ecode( int ecode )
{
   if( ecode < NIFTI_ECODE_IGNORE  ||   /* minimum code number (0) */
       ecode > NIFTI_MAX_ECODE     ||   /* maximum code number     */
       ecode & 1 )                      /* cannot be odd           */
      return 0;

   return 1;
}